

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggx.cpp
# Opt level: O2

vec3 __thiscall ggx::sample(ggx *this,vec3 *view_dir,vec2 *random_parameters)

{
  float __x;
  float fVar1;
  float fVar2;
  vec<3,_float,_(glm::precision)0> vVar3;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 aVar4;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_48;
  float local_38;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_28;
  
  __x = (random_parameters->field_0).field_0.x * 6.2831855;
  fVar1 = (random_parameters->field_0).field_0.y;
  fVar2 = this->_alpha;
  fVar1 = fVar1 / (1.0 - fVar1);
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar2 = fVar2 * fVar1;
  local_38 = cosf(__x);
  fVar1 = sinf(__x);
  local_48._0_8_ = CONCAT44(fVar1 * fVar2,local_38 * fVar2);
  local_48.field_0.z = 1.0;
  vVar3 = glm::detail::compute_normalize<3,_float,_(glm::precision)0,_glm::vec,_false>::call
                    ((vec<3,_float,_(glm::precision)0> *)&local_48.field_0);
  local_28.field_0.z = (float)vVar3.field_0._8_4_;
  local_28._0_8_ = vVar3.field_0._0_8_;
  vVar3 = glm::operator-(view_dir);
  local_48.field_0.z = (float)vVar3.field_0._8_4_;
  local_48._0_8_ = vVar3.field_0._0_8_;
  aVar4.field_0 =
       (anon_struct_12_3_4e92e0dd_for_anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3_0
        )glm::detail::compute_reflect<3,_float,_(glm::precision)0,_glm::vec,_false>::call
                   ((vec<3,_float,_(glm::precision)0> *)&local_48.field_0,
                    (vec<3,_float,_(glm::precision)0> *)&local_28.field_0);
  return (anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3)
         (anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3)aVar4.field_0;
}

Assistant:

glm::vec3 ggx::sample(const glm::vec3 &view_dir, const glm::vec2 &random_parameters) const
{
  float u1 = random_parameters.x;
  float u2 = random_parameters.y;

  // This is classic GGX sampling, it is rewritten to solve for X-axis side of right triangle. For simplicity,
  // we assume that other side is equal to 1. Hypotenuse is equal to sqrt(r^2+1). In that case:
  //   cos(theta) = (1) / sqrt(r^2+1)
  // Now we can transform standard GGX sampling method by comparing that cos(theta) and cos(theta) defined by
  // sampling method. In the end we get:
  //   r = alpha * sqrt(u/(1-u))

  const float phi = 2.0f * pi * u1;
  const float r = _alpha * sqrtf(u2/(1.0f - u2));

  const glm::vec3 h = glm::normalize(glm::vec3(r*cosf(phi), r*sinf(phi), 1.0f));
  const glm::vec3 l = glm::reflect(-view_dir, h);

  return l;
}